

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gia_GlaAddToCounters(Gla_Man_t *p,Vec_Int_t *vCore)

{
  int iVar1;
  Gla_Obj_t *pGVar2;
  int local_24;
  int i;
  Gla_Obj_t *pGla;
  Vec_Int_t *vCore_local;
  Gla_Man_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vCore), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vCore,local_24);
    pGVar2 = Gla_ManObj(p,iVar1);
    Vec_IntAddToEntry(p->vCoreCounts,pGVar2->iGiaObj,1);
  }
  return;
}

Assistant:

void Gia_GlaAddToCounters( Gla_Man_t * p, Vec_Int_t * vCore )
{
    Gla_Obj_t * pGla;
    int i;
    Gla_ManForEachObjAbsVec( vCore, p, pGla, i )
        Vec_IntAddToEntry( p->vCoreCounts, pGla->iGiaObj, 1 );
}